

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

uint8_t iff_getop(uint8_t *list,int pos)

{
  uint8_t result;
  uint8_t mask;
  uint8_t *item;
  int pos_local;
  uint8_t *list_local;
  
  if (-1 < pos) {
    return (uint8_t)((int)(uint)(list[pos / 4] & '\x03' << ((byte)(pos % 4 << 1) & 0x1f)) >>
                    ((byte)(pos % 4 << 1) & 0x1f));
  }
  __assert_fail("pos >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                ,0x4e7,"uint8_t iff_getop(uint8_t *, int)");
}

Assistant:

uint8_t
iff_getop(uint8_t *list, int pos)
{
    uint8_t *item;
    uint8_t mask = 3, result;

    assert(pos >= 0);

    item = &list[pos / 4];
    result = (*item) & (mask << 2 * (pos % 4));
    return result >> 2 * (pos % 4);
}